

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall
NavierStokesBase::SyncProjInterp
          (NavierStokesBase *this,MultiFab *phi,int c_lev,MultiFab *P_new,MultiFab *P_old,int f_lev,
          IntVect *ratio)

{
  DistributionMapping *a_ngrow;
  element_type *peVar1;
  pointer pGVar2;
  Geometry *pGVar3;
  double *pdVar4;
  int iVar5;
  Periodicity *period;
  int *piVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int index;
  long lVar14;
  long lVar15;
  int j;
  long lVar16;
  Real RVar17;
  initializer_list<int> __l;
  FabFactory<amrex::FArrayBox> *local_3c0;
  FabArray<amrex::FArrayBox> *local_3b8;
  Geometry *local_3b0;
  pointer local_3a8;
  Real local_3a0;
  Real local_398;
  Box local_38c;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> bc;
  MFIter mfi;
  FArrayBox fine_phi;
  Elixir fine_phi_i;
  Array4<double> local_298;
  Array4<double> local_258;
  BoxArray crse_ba;
  MultiFab crse_phi;
  
  peVar1 = (P_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar5 = (int)(((long)(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data) / 0x1c);
  local_3b8 = &P_old->super_FabArray<amrex::FArrayBox>;
  amrex::BoxArray::BoxArray(&crse_ba,(long)iVar5);
  index = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (; iVar5 != index; index = index + 1) {
    amrex::BoxArray::operator[]
              ((Box *)&mfi,&(P_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
               index);
    amrex::NodeBilinear::CoarseBox
              ((Box *)&crse_phi,(NodeBilinear *)&amrex::node_bilinear_interp,(Box *)&mfi,ratio);
    amrex::BoxArray::set(&crse_ba,index,(Box *)&crse_phi);
  }
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            (&bc.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,3,
             (allocator_type *)&crse_phi);
  pGVar2 = (((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.geom.
           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x100000001;
  mfi.fabArray = (FabArrayBase *)CONCAT44(mfi.fabArray._4_4_,1);
  __l._M_len = 3;
  __l._M_array = (iterator)&mfi;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&crse_phi,__l,(allocator_type *)&fine_phi);
  local_3a8 = pGVar2 + c_lev;
  a_ngrow = &(P_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  amrex::makeEBFabFactory
            ((Geometry *)&local_3c0,(BoxArray *)local_3a8,(DistributionMapping *)&crse_ba,
             (Vector<int,_std::allocator<int>_> *)a_ngrow,(EBSupport)&crse_phi);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&crse_phi);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  mfi.fabArray = (FabArrayBase *)0x0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  amrex::MultiFab::MultiFab(&crse_phi,&crse_ba,a_ngrow,1,0,(MFInfo *)&mfi,local_3c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&crse_phi.super_FabArray<amrex::FArrayBox>,1e+200);
  period = amrex::Periodicity::NonPeriodic();
  amrex::FabArray<amrex::FArrayBox>::ParallelCopy
            (&crse_phi.super_FabArray<amrex::FArrayBox>,&phi->super_FabArray<amrex::FArrayBox>,0,0,1
             ,period,COPY);
  amrex::EB_set_covered(&crse_phi,0.0);
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)P_new,true);
  local_3b0 = pGVar2 + f_lev;
  while( true ) {
    pGVar3 = local_3b0;
    if (mfi.endIndex <= mfi.currentIndex) break;
    amrex::MFIter::tilebox(&local_38c,&mfi);
    amrex::FArrayBox::FArrayBox
              ((FArrayBox *)&fine_phi.super_BaseFab<double>,&local_38c,1,true,false,(Arena *)0x0);
    amrex::BaseFab<double>::elixir<double,_0>(&fine_phi_i,&fine_phi.super_BaseFab<double>);
    piVar6 = &mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar6 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + mfi.currentIndex;
    }
    amrex::NodeBilinear::interp
              ((NodeBilinear *)&amrex::node_bilinear_interp,
               crse_phi.super_FabArray<amrex::FArrayBox>.m_fabs_v.
               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
               super__Vector_impl_data._M_start[*piVar6],0,
               (FArrayBox *)&fine_phi.super_BaseFab<double>,0,1,
               &fine_phi.super_BaseFab<double>.domain,ratio,local_3a8,pGVar3,&bc,0,1,Device);
    pdVar4 = fine_phi.super_BaseFab<double>.dptr;
    lVar16 = (long)fine_phi.super_BaseFab<double>.domain.smallend.vect[0];
    lVar12 = (long)fine_phi.super_BaseFab<double>.domain.smallend.vect[1];
    lVar7 = (long)fine_phi.super_BaseFab<double>.domain.smallend.vect[2];
    lVar13 = (long)((fine_phi.super_BaseFab<double>.domain.bigend.vect[0] -
                    fine_phi.super_BaseFab<double>.domain.smallend.vect[0]) + 1);
    lVar14 = (long)((fine_phi.super_BaseFab<double>.domain.bigend.vect[1] -
                    fine_phi.super_BaseFab<double>.domain.smallend.vect[1]) + 1);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_258,&P_new->super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_298,local_3b8,&mfi);
    local_398 = (Real)(long)local_38c.smallend.vect[1];
    lVar8 = (long)local_38c.smallend.vect[2];
    lVar10 = (long)local_38c.smallend.vect[0];
    local_3a0 = (Real)(local_258.kstride * 8);
    lVar7 = ((long)local_398 * 8 + (lVar8 - lVar7) * lVar14 * 8 + lVar12 * -8) * lVar13 + lVar10 * 8
            + lVar16 * -8 + (long)pdVar4;
    lVar12 = ((long)local_398 - (long)local_298.begin.y) * local_298.jstride * 8 +
             (lVar8 - local_298.begin.z) * local_298.kstride * 8 + lVar10 * 8 +
             (long)local_298.begin.x * -8 + (long)local_298.p;
    lVar10 = ((long)local_398 - (long)local_258.begin.y) * local_258.jstride * 8 +
             (lVar8 - local_258.begin.z) * (long)local_3a0 + lVar10 * 8 +
             (long)local_258.begin.x * -8 + (long)local_258.p;
    for (; lVar16 = lVar12, lVar11 = lVar10, lVar15 = lVar7, RVar17 = local_398,
        lVar8 <= local_38c.bigend.vect[2]; lVar8 = lVar8 + 1) {
      for (; (long)RVar17 <= (long)local_38c.bigend.vect[1]; RVar17 = (Real)((long)RVar17 + 1)) {
        if (local_38c.smallend.vect[0] <= local_38c.bigend.vect[0]) {
          lVar9 = 0;
          do {
            *(double *)(lVar11 + lVar9 * 8) =
                 *(double *)(lVar15 + lVar9 * 8) + *(double *)(lVar11 + lVar9 * 8);
            *(double *)(lVar16 + lVar9 * 8) =
                 *(double *)(lVar15 + lVar9 * 8) + *(double *)(lVar16 + lVar9 * 8);
            lVar9 = lVar9 + 1;
          } while ((local_38c.bigend.vect[0] - local_38c.smallend.vect[0]) + 1 != (int)lVar9);
        }
        lVar16 = lVar16 + local_298.jstride * 8;
        lVar11 = lVar11 + local_258.jstride * 8;
        lVar15 = lVar15 + lVar13 * 8;
      }
      lVar12 = lVar12 + local_298.kstride * 8;
      lVar10 = lVar10 + (long)local_3a0;
      lVar7 = lVar7 + lVar14 * lVar13 * 8;
    }
    amrex::Gpu::Elixir::~Elixir(&fine_phi_i);
    amrex::BaseFab<double>::~BaseFab(&fine_phi.super_BaseFab<double>);
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  amrex::EB_set_covered(P_new,0.0);
  amrex::EB_set_covered((MultiFab *)local_3b8,0.0);
  amrex::MultiFab::~MultiFab(&crse_phi);
  if (local_3c0 != (FabFactory<amrex::FArrayBox> *)0x0) {
    (*local_3c0->_vptr_FabFactory[1])();
  }
  std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
            ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&bc);
  amrex::BoxArray::~BoxArray(&crse_ba);
  return;
}

Assistant:

void
NavierStokesBase::SyncProjInterp (MultiFab& phi,
                                  int       c_lev,
                                  MultiFab& P_new,
                                  MultiFab& P_old,
                                  int       f_lev,
                                  IntVect&  ratio)
{
    BL_PROFILE("NavierStokesBase:::SyncProjInterp()");

    const BoxArray& P_grids = P_new.boxArray();
    const int       N       = P_grids.size();

    BoxArray crse_ba(N);

#ifdef _OPENMP
#pragma omp parallel for
#endif
    for (int i = 0; i < N; i++)
        crse_ba.set(i,node_bilinear_interp.CoarseBox(P_grids[i],ratio));

    // None  of these 3 are actually used by node_bilinear_interp()
    Vector<BCRec> bc(AMREX_SPACEDIM);
    const Geometry& fgeom   = parent->Geom(f_lev);
    const Geometry& cgeom   = parent->Geom(c_lev);

#ifdef AMREX_USE_EB
    // I am unsure of EBSupport and ng (set to 1 here)
    // need 1 ghost cell to use EB_set_covered on nodal MF
    // Factory is always CC, regardless of status of crse_ba
    auto factory = makeEBFabFactory(cgeom,crse_ba,P_new.DistributionMap(),{1,1,1},EBSupport::basic);
    MultiFab     crse_phi(crse_ba,P_new.DistributionMap(),1,0,MFInfo(),*factory);

#else
    MultiFab     crse_phi(crse_ba,P_new.DistributionMap(),1,0);
#endif

    crse_phi.setVal(1.e200);
    crse_phi.ParallelCopy(phi,0,0,1);

#ifdef AMREX_USE_EB
    // FIXME -
    // For now, just zero covered fine cells. Better interpolation to come...
    ///
    EB_set_covered(crse_phi,0.);
#endif

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(P_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
	const Box&  bx     = mfi.tilebox();
	FArrayBox fine_phi(bx,1);
	Elixir fine_phi_i = fine_phi.elixir();
	node_bilinear_interp.interp(crse_phi[mfi],0,fine_phi,0,1,
				    fine_phi.box(),ratio,cgeom,fgeom,bc,
				    0,Press_Type,RunOn::Gpu);

	auto const& f_phi    = fine_phi.array();
	auto const& p_new    = P_new.array(mfi);
	auto const& p_old    = P_old.array(mfi);
	amrex::ParallelFor(bx, [f_phi, p_old, p_new]
        AMREX_GPU_DEVICE(int i, int j, int k) noexcept
        {
	  p_new(i,j,k) += f_phi(i,j,k);
	  p_old(i,j,k) += f_phi(i,j,k);
	});
    }

#ifdef AMREX_USE_EB
    // FIXME? - this can probably go after new interpolation is implemented
    EB_set_covered(P_new,0.);
    EB_set_covered(P_old,0.);
#endif

}